

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_req.cc
# Opt level: O0

int X509_REQ_add0_attr(X509_REQ *req,X509_ATTRIBUTE *attr)

{
  stack_st_X509_ATTRIBUTE *psVar1;
  size_t sVar2;
  X509_ATTRIBUTE *attr_local;
  X509_REQ *req_local;
  
  if (req->req_info->attributes == (stack_st_X509_ATTRIBUTE *)0x0) {
    psVar1 = sk_X509_ATTRIBUTE_new_null();
    req->req_info->attributes = psVar1;
  }
  if ((req->req_info->attributes != (stack_st_X509_ATTRIBUTE *)0x0) &&
     (sVar2 = sk_X509_ATTRIBUTE_push(req->req_info->attributes,attr), sVar2 != 0)) {
    return 1;
  }
  return 0;
}

Assistant:

static int X509_REQ_add0_attr(X509_REQ *req, X509_ATTRIBUTE *attr) {
  if (req->req_info->attributes == NULL) {
    req->req_info->attributes = sk_X509_ATTRIBUTE_new_null();
  }
  if (req->req_info->attributes == NULL ||
      !sk_X509_ATTRIBUTE_push(req->req_info->attributes, attr)) {
    return 0;
  }

  return 1;
}